

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *u_00;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> *this;
  Jacobian<Measurement,_Measurement> *pJVar1;
  SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *s;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *this_00;
  MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  *m;
  MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  *m_00;
  float fVar2;
  State *pSVar3;
  Matrix<float,_3,_1,_0,_3,_1> *pMVar4;
  ostream *poVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  result_type rVar9;
  undefined1 local_2c0 [8];
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> ukf;
  SystemModel sys;
  PositionModel pm;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> predictor;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> ekf;
  OrientationModel om;
  normal_distribution<float> noise;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_80;
  undefined1 local_78 [8];
  State x_ukf;
  float fStack_64;
  State x_ekf;
  Control u;
  OrientationMeasurement orientation;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_40);
  KalmanExamples::Robot1::SystemModel<float,_Kalman::StandardBase>::SystemModel
            ((SystemModel<float,_Kalman::StandardBase> *)
             ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c));
  KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
  PositionMeasurementModel
            ((PositionMeasurementModel<float,_Kalman::StandardBase> *)
             ((long)sys.
                    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                    .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x20),-10.0,-10.0,30.0,75.0);
  KalmanExamples::Robot1::OrientationMeasurementModel<float,_Kalman::StandardBase>::
  OrientationMeasurementModel
            ((OrientationMeasurementModel<float,_Kalman::StandardBase> *)
             ((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c));
  local_80._M_x = 0x1b207;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .V.super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>)0x0;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._28_4_ = 0x3f800000;
  Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_>::ExtendedKalmanFilter
            ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)&pm.landmark2);
  this = (ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)
         ((long)&predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                 super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data + 0x1c
         );
  Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_>::ExtendedKalmanFilter(this);
  Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)local_2c0,1.0,2.0,0.0);
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Matrix<float,_3,_1,_0,_3,_1> *)&pm.landmark2,(Matrix<float,_3,_1,_0,_3,_1> *)&local_40
            );
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Matrix<float,_3,_1,_0,_3,_1> *)this,(Matrix<float,_3,_1,_0,_3,_1> *)&local_40);
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Matrix<float,_3,_1,_0,_3,_1> *)local_2c0,(Matrix<float,_3,_1,_0,_3,_1> *)&local_40);
  for (uVar6 = 1; uVar6 != 0x65; uVar6 = uVar6 + 1) {
    x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         1.0627905;
    fVar7 = (float)(&DAT_00152040)[0x32 < uVar6] + local_38;
    local_34 = local_40;
    fVar8 = cosf(fVar7);
    fVar2 = local_3c;
    local_34 = fVar8 * x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                       array[2] + local_34;
    fVar8 = sinf(fVar7);
    local_3c = fVar8 * x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                       array[2] + fVar2;
    local_40 = local_34;
    pJVar1 = &om.
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
              .V;
    local_38 = fVar7;
    rVar9 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)pJVar1,&local_80);
    local_40 = rVar9 * 0.1 + local_40;
    rVar9 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)pJVar1,&local_80);
    local_3c = rVar9 * 0.1 + local_3c;
    rVar9 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)pJVar1,&local_80);
    local_38 = rVar9 * 0.1 + local_38;
    s = (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *)
        ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data + 0x1c)
    ;
    u_00 = (float *)((long)x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                           super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + 8);
    pSVar3 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&pm.landmark2,
                        s,(Control<float> *)u_00);
    fVar2 = (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    local_34 = (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
    ;
    fVar7 = (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    this_00 = (ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
              ((long)&predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                      super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
              0x1c);
    pSVar3 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       (this_00,s,(Control<float> *)u_00);
    unique0x00012000 =
         *(undefined8 *)
          (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
    x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pSVar3 = Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)local_2c0,
                        (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         *)s,(Control<float> *)u_00);
    local_78 = *(undefined1 (*) [8])
                (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
                super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
    x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (pSVar3->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = local_38
    ;
    rVar9 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       &om.
                        super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                        .V,&local_80);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         rVar9 * 0.025 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    m = (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
         *)((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                   super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                   super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           0x1c);
    pMVar4 = (Matrix<float,_3,_1,_0,_3,_1> *)
             Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
                       (this_00,m,(OrientationMeasurement<float> *)&u);
    Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 8),pMVar4);
    pMVar4 = (Matrix<float,_3,_1,_0,_3,_1> *)
             Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)local_2c0,
                        (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                         *)m,(OrientationMeasurement<float> *)&u);
    Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Matrix<float,_3,_1,_0,_3,_1> *)local_78,pMVar4);
    m_00 = (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            *)((long)sys.
                     super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                     .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                     .array + 0x20);
    KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::h
              ((PositionMeasurementModel<float,_Kalman::StandardBase> *)&u,(S *)m_00);
    pJVar1 = &om.
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
              .V;
    rVar9 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)pJVar1,&local_80);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         rVar9 * 0.25 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    rVar9 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)pJVar1,&local_80);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         rVar9 * 0.25 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1];
    pMVar4 = (Matrix<float,_3,_1,_0,_3,_1> *)
             Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)&predictor.
                                super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x1c),m_00,(PositionMeasurement<float> *)&u);
    Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 8),pMVar4);
    pMVar4 = (Matrix<float,_3,_1,_0,_3,_1> *)
             Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)local_2c0,
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)m_00,(PositionMeasurement<float> *)&u);
    Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Matrix<float,_3,_1,_0,_3,_1> *)local_78,pMVar4);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar2);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_34);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar7);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[2]);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fStack_64);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[0]);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_78._0_4_);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_78._4_4_);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[0]);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Simulated (true) system state
    State x;
    x.setZero();
    
    // Control input
    Control u;
    // System
    SystemModel sys;
    
    // Measurement models
    // Set position landmarks at (-10, -10) and (30, 75)
    PositionModel pm(-10, -10, 30, 75);
    OrientationModel om;
    
    // Random number generation (for noise simulation)
    std::default_random_engine generator;
    generator.seed( 111111 );
    std::normal_distribution<T> noise(0, 1);
    
    // Some filters for estimation
    // Pure predictor without measurement updates
    Kalman::ExtendedKalmanFilter<State> predictor;
    // Extended Kalman Filter
    Kalman::ExtendedKalmanFilter<State> ekf;
    // Unscented Kalman Filter
    Kalman::UnscentedKalmanFilter<State> ukf(1);
    
    // Init filters with true system state
    predictor.init(x);
    ekf.init(x);
    ukf.init(x);
    
    // Standard-Deviation of noise added to all state vector components during state transition
    T systemNoise = 0.1;
    // Standard-Deviation of noise added to all measurement vector components in orientation measurements
    T orientationNoise = 0.025;
    // Standard-Deviation of noise added to all measurement vector components in distance measurements
    T distanceNoise = 0.25;
    
    // Simulate for 100 steps
    const size_t N = 100;
    for(size_t i = 1; i <= N; i++)
    {
        // Generate some control input
        u.v() = 1. + std::sin( T(2) * T(M_PI) / T(N) );
        u.dtheta() = std::sin( T(2) * T(M_PI) / T(N) ) * (1 - 2*(i > 50));
        
        // Simulate system
        x = sys.f(x, u);
        
        // Add noise: Our robot move is affected by noise (due to actuator failures)
        x.x() += systemNoise*noise(generator);
        x.y() += systemNoise*noise(generator);
        x.theta() += systemNoise*noise(generator);
        
        // Predict state for current time-step using the filters
        auto x_pred = predictor.predict(sys, u);
        auto x_ekf = ekf.predict(sys, u);
        auto x_ukf = ukf.predict(sys, u);
        
        // Orientation measurement
        {
            // We can measure the orientation every 5th step
            OrientationMeasurement orientation = om.h(x);
            
            // Measurement is affected by noise as well
            orientation.theta() += orientationNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(om, orientation);
            
            // Update UKF
            x_ukf = ukf.update(om, orientation);
        }
        
        // Position measurement
        {
            // We can measure the position every 10th step
            PositionMeasurement position = pm.h(x);
            
            // Measurement is affected by noise as well
            position.d1() += distanceNoise * noise(generator);
            position.d2() += distanceNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(pm, position);
            
            // Update UKF
            x_ukf = ukf.update(pm, position);
        }
        
        // Print to stdout as csv format
        std::cout   << x.x() << "," << x.y() << "," << x.theta() << ","
                    << x_pred.x() << "," << x_pred.y() << "," << x_pred.theta()  << ","
                    << x_ekf.x() << "," << x_ekf.y() << "," << x_ekf.theta()  << ","
                    << x_ukf.x() << "," << x_ukf.y() << "," << x_ukf.theta()
                    << std::endl;
    }
    
    return 0;
}